

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O2

void __thiscall
GdlNumericExpression::GdlNumericExpression(GdlNumericExpression *this,int nValue,int munits)

{
  GdlSimpleExpression::GdlSimpleExpression((GdlSimpleExpression *)this);
  *(undefined ***)this = &PTR_Clone_00212000;
  this->m_nValue = nValue;
  this->m_munits = munits;
  this->m_fBoolean = false;
  GdlExpression::SetType((GdlExpression *)this,(uint)(munits != -1) * 2 + kexptNumber);
  return;
}

Assistant:

GdlNumericExpression(int nValue, int munits)
		:	GdlSimpleExpression(),
			m_nValue(nValue),
			m_munits(munits),
			m_fBoolean(false)
	{
		if (m_munits == kmunitNone)
			SetType(kexptNumber);
		else
			SetType(kexptMeas);
	}